

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputTokenizer.h
# Opt level: O2

void __thiscall InputTokenizer::Lexeme::~Lexeme(Lexeme *this)

{
  this->_vptr_Lexeme = (_func_int **)&PTR__Lexeme_00129a30;
  std::__cxx11::string::~string((string *)&this->token);
  return;
}

Assistant:

virtual ~Lexeme() {}